

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c++
# Opt level: O2

void __thiscall kj::Thread::detach(Thread *this)

{
  int osErrorNumber;
  Fault f;
  
  osErrorNumber = pthread_detach(this->threadId);
  if (osErrorNumber != 0) {
    kj::_::Debug::Fault::Fault
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/thread.c++"
               ,0x78,osErrorNumber,"pthread_detach","");
    kj::_::Debug::Fault::~Fault(&f);
  }
  this->detached = true;
  ThreadState::unref(this->state);
  return;
}

Assistant:

void Thread::detach() {
  int pthreadResult = pthread_detach(*reinterpret_cast<pthread_t*>(&threadId));
  if (pthreadResult != 0) {
    KJ_FAIL_SYSCALL("pthread_detach", pthreadResult) { break; }
  }
  detached = true;
  state->unref();
}